

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O0

RC __thiscall SM_Manager::CreateIndex(SM_Manager *this,char *relName,char *attrName)

{
  RC RVar1;
  ostream *poVar2;
  bool local_1b9;
  bool local_195;
  RID local_158;
  RID rid;
  char *pData;
  RM_Record rec;
  RM_FileScan fs;
  RM_FileHandle fh;
  AttrCatEntry *pAStack_80;
  IX_IndexHandle ih;
  AttrCatEntry *aEntry;
  RM_Record attrRec;
  RelCatEntry *local_50;
  RelCatEntry *rEntry;
  RM_Record relRec;
  RC rc;
  char *attrName_local;
  char *relName_local;
  SM_Manager *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"CreateIndex\n");
  poVar2 = std::operator<<(poVar2,"   relName =");
  poVar2 = std::operator<<(poVar2,relName);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"   attrName=");
  poVar2 = std::operator<<(poVar2,attrName);
  std::operator<<(poVar2,"\n");
  relRec._20_4_ = 0;
  RM_Record::RM_Record((RM_Record *)&rEntry);
  relRec._20_4_ = GetRelEntry(this,relName,(RM_Record *)&rEntry,&local_50);
  if (relRec._20_4_ == 0) {
    RM_Record::RM_Record((RM_Record *)&aEntry);
    relRec._20_4_ = FindAttr(this,relName,attrName,(RM_Record *)&aEntry,&stack0xffffffffffffff80);
    if (relRec._20_4_ == 0) {
      if (pAStack_80->indexNo == -1) {
        relRec._20_4_ =
             IX_Manager::CreateIndex
                       (this->ixm,relName,local_50->indexCurrNum,pAStack_80->attrType,
                        pAStack_80->attrLength);
        if (relRec._20_4_ == 0) {
          IX_IndexHandle::IX_IndexHandle((IX_IndexHandle *)&fh.field_0x47);
          RM_FileHandle::RM_FileHandle((RM_FileHandle *)&fs.useNextPage);
          RM_FileScan::RM_FileScan((RM_FileScan *)&rec.size);
          relRec._20_4_ =
               IX_Manager::OpenIndex
                         (this->ixm,relName,local_50->indexCurrNum,(IX_IndexHandle *)&fh.field_0x47)
          ;
          if (relRec._20_4_ == 0) {
            relRec._20_4_ = RM_Manager::OpenFile(this->rmm,relName,(RM_FileHandle *)&fs.useNextPage)
            ;
            if (relRec._20_4_ == 0) {
              relRec._20_4_ =
                   RM_FileScan::OpenScan
                             ((RM_FileScan *)&rec.size,(RM_FileHandle *)&fs.useNextPage,INT,4,0,
                              NO_OP,(void *)0x0,NO_HINT);
              if (relRec._20_4_ == 0) {
                RM_Record::RM_Record((RM_Record *)&pData);
                do {
                  RVar1 = RM_FileScan::GetNextRec((RM_FileScan *)&rec.size,(RM_Record *)&pData);
                  if (RVar1 == 0x6e) {
                    relRec._20_4_ = RM_FileScan::CloseScan((RM_FileScan *)&rec.size);
                    if (((relRec._20_4_ == 0) &&
                        (relRec._20_4_ =
                              RM_Manager::CloseFile(this->rmm,(RM_FileHandle *)&fs.useNextPage),
                        relRec._20_4_ == 0)) &&
                       (relRec._20_4_ =
                             IX_Manager::CloseIndex(this->ixm,(IX_IndexHandle *)&fh.field_0x47),
                       relRec._20_4_ == 0)) {
                      pAStack_80->indexNo = local_50->indexCurrNum;
                      local_50->indexCurrNum = local_50->indexCurrNum + 1;
                      local_50->indexCount = local_50->indexCount + 1;
                      relRec._20_4_ = RM_FileHandle::UpdateRec(&this->relcatFH,(RM_Record *)&rEntry)
                      ;
                      if ((relRec._20_4_ == 0) &&
                         (relRec._20_4_ =
                               RM_FileHandle::UpdateRec(&this->attrcatFH,(RM_Record *)&aEntry),
                         relRec._20_4_ == 0)) {
                        RVar1 = RM_FileHandle::ForcePages(&this->relcatFH,-1);
                        local_1b9 = true;
                        if (RVar1 == 0) {
                          RVar1 = RM_FileHandle::ForcePages(&this->attrcatFH,-1);
                          local_1b9 = RVar1 != 0;
                        }
                        relRec._20_4_ = ZEXT14(local_1b9);
                        if (local_1b9 == false) {
                          this_local._4_4_ = 0;
                          attrRec.size = 1;
                        }
                        else {
                          attrRec.size = 1;
                          this_local._4_4_ = relRec._20_4_;
                        }
                      }
                      else {
                        this_local._4_4_ = relRec._20_4_;
                        attrRec.size = 1;
                      }
                    }
                    else {
                      this_local._4_4_ = relRec._20_4_;
                      attrRec.size = 1;
                    }
                    break;
                  }
                  RID::RID(&local_158);
                  RVar1 = RM_Record::GetData((RM_Record *)&pData,(char **)&rid);
                  local_195 = true;
                  if (RVar1 == 0) {
                    RVar1 = RM_Record::GetRid((RM_Record *)&pData,&local_158);
                    local_195 = RVar1 != 0;
                  }
                  relRec._20_4_ = ZEXT14(local_195);
                  if (local_195 == false) {
                    relRec._20_4_ =
                         IX_IndexHandle::InsertEntry
                                   ((IX_IndexHandle *)&fh.field_0x47,
                                    (void *)((long)rid + (long)pAStack_80->offset),&local_158);
                    if (relRec._20_4_ == 0) {
                      attrRec.size = 0;
                    }
                    else {
                      attrRec.size = 1;
                      this_local._4_4_ = relRec._20_4_;
                    }
                  }
                  else {
                    attrRec.size = 1;
                    this_local._4_4_ = relRec._20_4_;
                  }
                  RID::~RID(&local_158);
                } while (attrRec.size == 0);
                RM_Record::~RM_Record((RM_Record *)&pData);
              }
              else {
                attrRec.size = 1;
                this_local._4_4_ = relRec._20_4_;
              }
            }
            else {
              attrRec.size = 1;
              this_local._4_4_ = relRec._20_4_;
            }
          }
          else {
            attrRec.size = 1;
            this_local._4_4_ = relRec._20_4_;
          }
          RM_FileScan::~RM_FileScan((RM_FileScan *)&rec.size);
          RM_FileHandle::~RM_FileHandle((RM_FileHandle *)&fs.useNextPage);
          IX_IndexHandle::~IX_IndexHandle((IX_IndexHandle *)&fh.field_0x47);
        }
        else {
          attrRec.size = 1;
          this_local._4_4_ = relRec._20_4_;
        }
      }
      else {
        this_local._4_4_ = 0x132;
        attrRec.size = 1;
      }
    }
    else {
      attrRec.size = 1;
      this_local._4_4_ = relRec._20_4_;
    }
    RM_Record::~RM_Record((RM_Record *)&aEntry);
  }
  else {
    attrRec.size = 1;
    this_local._4_4_ = relRec._20_4_;
  }
  RM_Record::~RM_Record((RM_Record *)&rEntry);
  return this_local._4_4_;
}

Assistant:

RC SM_Manager::CreateIndex(const char *relName,
                           const char *attrName)
{
  cout << "CreateIndex\n"
    << "   relName =" << relName << "\n"
    << "   attrName=" << attrName << "\n";

  RC rc = 0;
  RM_Record relRec;
  RelCatEntry *rEntry;
  if((rc = GetRelEntry(relName, relRec, rEntry))) // get the relation info
    return (rc);

  // Find the attribute associated with this index
  RM_Record attrRec; 
  AttrCatEntry *aEntry;
  if((rc = FindAttr(relName, attrName, attrRec, aEntry))){
    return (rc);
  }

  // check there isnt already an index
  if(aEntry->indexNo != NO_INDEXES)
    return (SM_INDEXEDALREADY);

  // Create this index
  if((rc = ixm.CreateIndex(relName, rEntry->indexCurrNum, aEntry->attrType, aEntry->attrLength)))
    return (rc);

  // Gets ready to scan through the file associated with the relation
  IX_IndexHandle ih;
  RM_FileHandle fh;
  RM_FileScan fs;
  if((rc = ixm.OpenIndex(relName, rEntry->indexCurrNum, ih)))
    return (rc);
  if((rc = rmm.OpenFile(relName, fh)))
    return (rc);

  // scan through the entire file:
  if((rc = fs.OpenScan(fh, INT, 4, 0, NO_OP, NULL))){
    return (rc);
  }
  RM_Record rec;
  while(fs.GetNextRec(rec) != RM_EOF){
    char *pData;
    RID rid;
    if((rc = rec.GetData(pData) || (rc = rec.GetRid(rid)))) // retrieve the record
      return (rc);
    if((rc = ih.InsertEntry(pData+ aEntry->offset, rid))) // insert into index
      return (rc);
  }
  if((rc = fs.CloseScan()) || (rc = rmm.CloseFile(fh)) || (rc = ixm.CloseIndex(ih)))
    return (rc);
  // Close all scans, indices and files
  
  // rewrite entry for attribute and relation in attrcat and relcat
  aEntry->indexNo = rEntry->indexCurrNum;
  rEntry->indexCurrNum++;
  rEntry->indexCount++;

  // write both back
  if((rc = relcatFH.UpdateRec(relRec)) || (rc = attrcatFH.UpdateRec(attrRec)))
    return (rc);
  if((rc = relcatFH.ForcePages() || (rc = attrcatFH.ForcePages())))
    return (rc);

  return (0);
}